

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmBlock * anon_unknown.dwarf_c91b1::BlockIdomIntersect(VmBlock *b1,VmBlock *b2)

{
  VmBlock *local_18;
  VmBlock *b2_local;
  VmBlock *b1_local;
  
  local_18 = b2;
  b2_local = b1;
  while (b2_local != local_18) {
    for (; b2_local->controlGraphPostOrderId < local_18->controlGraphPostOrderId;
        b2_local = b2_local->idom) {
    }
    for (; local_18->controlGraphPostOrderId < b2_local->controlGraphPostOrderId;
        local_18 = local_18->idom) {
    }
  }
  return b2_local;
}

Assistant:

VmBlock* BlockIdomIntersect(VmBlock* b1, VmBlock* b2)
	{
		while(b1 != b2)
		{
			while(b1->controlGraphPostOrderId < b2->controlGraphPostOrderId)
				b1 = b1->idom;

			while(b2->controlGraphPostOrderId < b1->controlGraphPostOrderId)
				b2 = b2->idom;
		}

		return b1;
	}